

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgp.cpp
# Opt level: O0

bool bgp_update_handle_path_attribute
               (bgp_peer *peer,uchar *buff,uint16_t unfeasible_routes_length,
               uint16_t total_path_attribute_length,adj_ribs_in_data *route_data)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  uint32_t uVar4;
  char *local_410;
  string local_408 [32];
  ostringstream local_3e8 [8];
  ostringstream oss_1;
  int local_26c;
  uint32_t asn_4;
  int i_1;
  string as_list_str_1;
  uint8_t segment_length_1;
  uint8_t segment_type_1;
  char *pcStack_240;
  in_addr_t local_238;
  ushort local_232;
  uint32_t address;
  uint32_t uStack_22c;
  uint16_t asn_2;
  uint32_t asn_3;
  uint32_t local_pref;
  uint32_t med;
  char *local_218;
  string local_210 [38];
  uint16_t local_1ea;
  uint32_t local_1e8;
  uint16_t asn_1;
  uint32_t asn;
  ostringstream local_1d8 [8];
  ostringstream oss;
  int local_60;
  int i;
  bool is_overflowed;
  string as_list_str;
  ushort local_30;
  byte local_2e;
  byte local_2d;
  uint8_t segment_length;
  uint8_t segment_type;
  int iStack_2c;
  uint8_t origin;
  uint16_t attribute_len;
  uint8_t type;
  uint8_t flag;
  int read_length;
  adj_ribs_in_data *route_data_local;
  uint16_t total_path_attribute_length_local;
  uchar *puStack_18;
  uint16_t unfeasible_routes_length_local;
  uchar *buff_local;
  bgp_peer *peer_local;
  
  iStack_2c = unfeasible_routes_length + 0x17;
  _attribute_len = route_data;
  route_data_local._4_2_ = total_path_attribute_length;
  route_data_local._6_2_ = unfeasible_routes_length;
  puStack_18 = buff;
  buff_local = (uchar *)peer;
  do {
    if ((int)(route_data_local._6_2_ + 0x17 + (uint)route_data_local._4_2_) <= iStack_2c) {
      return true;
    }
    local_2d = puStack_18[iStack_2c];
    local_2e = puStack_18[iStack_2c + 1];
    iVar3 = iStack_2c + 2;
    if ((local_2d & 0x10) == 0) {
      local_30 = (ushort)puStack_18[iVar3];
      iStack_2c = iStack_2c + 3;
    }
    else {
      iStack_2c = iVar3;
      local_30 = ntohs(*(uint16_t *)(puStack_18 + iVar3));
      iStack_2c = iStack_2c + 2;
    }
    switch(local_2e) {
    case 1:
      as_list_str.field_2._M_local_buf[0xf] = puStack_18[iStack_2c];
      (_attribute_len->path_attr).origin = as_list_str.field_2._M_local_buf[0xf];
      log<unsigned_char>(INFO,"Origin %d",(uchar *)(as_list_str.field_2._M_local_buf + 0xf));
      break;
    case 2:
      as_list_str.field_2._M_local_buf[0xe] = puStack_18[iStack_2c];
      as_list_str.field_2._M_local_buf[0xd] = puStack_18[iStack_2c + 1];
      if (as_list_str.field_2._M_local_buf[0xe] == '\x02') {
        std::__cxx11::string::string((string *)&i);
        bVar2 = false;
        for (local_60 = 0; local_60 < (int)(uint)(byte)as_list_str.field_2._M_local_buf[0xd];
            local_60 = local_60 + 1) {
          std::__cxx11::ostringstream::ostringstream(local_1d8);
          std::__cxx11::string::append((char *)&i);
          if ((buff_local[10] & 1) == 0) {
            local_1ea = *(uint16_t *)(puStack_18 + (iStack_2c + 2 + local_60 * 2));
            local_1ea = ntohs(local_1ea);
            std::ostream::operator<<((ostream *)local_1d8,local_1ea);
            if ((_attribute_len->path_attr).as_path_length < 0x40) {
              bVar1 = (_attribute_len->path_attr).as_path_length;
              (_attribute_len->path_attr).as_path_length = bVar1 + 1;
              (_attribute_len->path_attr).as_path[bVar1] = (uint)local_1ea;
            }
            else {
              bVar2 = true;
            }
          }
          else {
            local_1e8 = *(uint32_t *)(puStack_18 + (iStack_2c + 2 + local_60 * 4));
            local_1e8 = ntohl(local_1e8);
            std::ostream::operator<<((ostream *)local_1d8,local_1e8);
            if ((_attribute_len->path_attr).as_path_length < 0x40) {
              bVar1 = (_attribute_len->path_attr).as_path_length;
              (_attribute_len->path_attr).as_path_length = bVar1 + 1;
              (_attribute_len->path_attr).as_path[bVar1] = local_1e8;
            }
            else {
              bVar2 = true;
            }
          }
          std::__cxx11::ostringstream::str();
          std::__cxx11::string::append((string *)&i);
          std::__cxx11::string::~string(local_210);
          std::__cxx11::ostringstream::~ostringstream(local_1d8);
        }
        if (bVar2) {
          log<unsigned_char>(WARNING,"Overflowed AS PATH %d",
                             (uchar *)(as_list_str.field_2._M_local_buf + 0xd));
        }
        local_218 = (char *)std::__cxx11::string::c_str();
        log<char_const*>(INFO,"AS Path%s",&local_218);
        std::__cxx11::string::~string((string *)&i);
      }
      else {
        log<unsigned_char>(DEBUG,"Unable to interpret segment type %d",
                           (uchar *)(as_list_str.field_2._M_local_buf + 0xe));
      }
      break;
    case 3:
      if (local_30 != 4) {
        __assert_fail("attribute_len == 4",
                      "/workspace/llm4binary/github/license_c_cmakelists/kametan0730[P]my_awesome_bgp/bgp.cpp"
                      ,0x138,
                      "bool bgp_update_handle_path_attribute(bgp_peer *, const unsigned char *, uint16_t, uint16_t, adj_ribs_in_data &)"
                     );
      }
      (_attribute_len->path_attr).next_hop =
           (uint)puStack_18[iStack_2c] * 0x1000000 + (uint)puStack_18[iStack_2c + 1] * 0x10000 +
           (uint)puStack_18[iStack_2c + 2] * 0x100 + (uint)puStack_18[iStack_2c + 3];
      local_pref = ntohl((_attribute_len->path_attr).next_hop);
      _med = inet_ntoa((in_addr)local_pref);
      log<char*>(INFO,"Next Hop %s",(char **)&med);
      break;
    case 4:
      asn_3 = *(uint32_t *)(puStack_18 + iStack_2c);
      asn_3 = ntohl(asn_3);
      (_attribute_len->path_attr).med = asn_3;
      log<unsigned_int>(INFO,"MED %d",&asn_3);
      break;
    case 5:
      uStack_22c = *(uint32_t *)(puStack_18 + iStack_2c);
      uStack_22c = ntohl(uStack_22c);
      (_attribute_len->path_attr).local_pref = uStack_22c;
      log<unsigned_int>(INFO,"Local Pref %d",&stack0xfffffffffffffdd4);
      break;
    case 6:
      log<>(INFO,"Atomic Aggregate");
      break;
    case 7:
      if ((buff_local[10] & 1) == 0) {
        local_232 = *(ushort *)(puStack_18 + iStack_2c);
        iStack_2c = iStack_2c + 2;
        address = (uint32_t)local_232;
      }
      else {
        address = *(uint32_t *)(puStack_18 + iStack_2c);
        iStack_2c = iStack_2c + 4;
      }
      as_list_str_1.field_2._12_4_ = *(undefined4 *)(puStack_18 + iStack_2c);
      local_238 = as_list_str_1.field_2._12_4_;
      pcStack_240 = inet_ntoa((in_addr)as_list_str_1.field_2._12_4_);
      log<unsigned_int,char*>(INFO,"Aggregator %d, %s",&address,&stack0xfffffffffffffdc0);
      break;
    default:
      log<unsigned_char>(INFO,"Unhandled path attributes type %d",&local_2e);
      break;
    case 0x11:
      as_list_str_1.field_2._M_local_buf[0xb] = puStack_18[iStack_2c];
      as_list_str_1.field_2._M_local_buf[10] = puStack_18[iStack_2c + 1];
      if (as_list_str_1.field_2._M_local_buf[0xb] == '\x02') {
        std::__cxx11::string::string((string *)&asn_4);
        for (local_26c = 0; local_26c < (int)(uint)(byte)as_list_str_1.field_2._M_local_buf[10];
            local_26c = local_26c + 1) {
          uVar4 = ntohl(*(uint32_t *)(puStack_18 + (iStack_2c + 2 + local_26c * 4)));
          std::__cxx11::ostringstream::ostringstream(local_3e8);
          std::ostream::operator<<((ostream *)local_3e8,uVar4);
          std::__cxx11::string::append((char *)&asn_4);
          std::__cxx11::ostringstream::str();
          std::__cxx11::string::append((string *)&asn_4);
          std::__cxx11::string::~string(local_408);
          std::__cxx11::ostringstream::~ostringstream(local_3e8);
        }
        local_410 = (char *)std::__cxx11::string::c_str();
        log<char_const*>(INFO,"AS4 Path%s",&local_410);
        std::__cxx11::string::~string((string *)&asn_4);
      }
      else {
        log<unsigned_char>(DEBUG,"Unable to interpret segment type %d",
                           (uchar *)(as_list_str_1.field_2._M_local_buf + 0xb));
      }
    }
    iStack_2c = (uint)local_30 + iStack_2c;
  } while( true );
}

Assistant:

bool bgp_update_handle_path_attribute(bgp_peer* peer, const unsigned char* buff, uint16_t unfeasible_routes_length, uint16_t total_path_attribute_length, adj_ribs_in_data& route_data){

    int read_length = 19 + 2 + unfeasible_routes_length + 2;
    while(read_length < 19 + 2 + unfeasible_routes_length + 2 + total_path_attribute_length){
        uint8_t flag = buff[read_length];
        uint8_t type = buff[read_length + 1];
        read_length += 2;
        uint16_t attribute_len;
        if(!(flag & EXTENDED_LENGTH)){
            attribute_len = buff[read_length];
            read_length += 1;
        }else{
            memcpy(&attribute_len, &buff[read_length], 2);
            attribute_len = ntohs(attribute_len);
            read_length += 2;
        }
        switch(type){
            case ORIGIN:{
                uint8_t origin = buff[read_length];
                route_data.path_attr.origin = origin;
                log(log_level::INFO, "Origin %d", origin);
            }
                break;
            case AS_PATH:{
                uint8_t segment_type = buff[read_length];
                uint8_t segment_length = buff[read_length + 1];
                if(segment_type == bgp_path_attribute_as_path_segment_type::AS_SEQUENCE){
                    std::string as_list_str;
                    bool is_overflowed = false;
                    for(int i = 0; i < segment_length; i++){
                        std::ostringstream oss;
                        as_list_str.append(" ");
                        if(peer->is_4_octet_as_supported){
                            uint32_t asn;
                            memcpy(&asn, &buff[read_length + 2 + i * 4], 4);
                            asn = ntohl(asn);
                            oss << asn;
                            if(route_data.path_attr.as_path_length < 64){
                                route_data.path_attr.as_path[route_data.path_attr.as_path_length++] = asn;
                            }else{
                                is_overflowed = true;
                            }
                        }else{
                            uint16_t asn;
                            memcpy(&asn, &buff[read_length + 2 + i * 2], 2);
                            asn = ntohs(asn);
                            oss << asn;
                            if(route_data.path_attr.as_path_length < 64){
                                route_data.path_attr.as_path[route_data.path_attr.as_path_length++] = asn;
                            }else{
                                is_overflowed = true;
                            }
                        }
                        as_list_str.append(oss.str());
                    }
                    if(is_overflowed){
                        log(log_level::WARNING, "Overflowed AS PATH %d", segment_length);

                    }
                    log(log_level::INFO, "AS Path%s", as_list_str.c_str());
                }else{
                    log(log_level::DEBUG, "Unable to interpret segment type %d", segment_type);
                }
            }
                break;
            case NEXT_HOP:{
                assert(attribute_len == 4);
                route_data.path_attr.next_hop = buff[read_length]*256*256*256 + buff[read_length + 1]*256*256 + buff[read_length + 2]*256 + buff[read_length + 3];
                log(log_level::INFO, "Next Hop %s", inet_ntoa(in_addr{.s_addr = ntohl(route_data.path_attr.next_hop)}));
            }
                break;
            case MULTI_EXIT_DISC:
                uint32_t med;
                memcpy(&med, &buff[read_length], 4);
                med = ntohl(med);
                route_data.path_attr.med = med;
                log(log_level::INFO, "MED %d", med);
                break;
            case LOCAL_PREF:{
                uint32_t local_pref;
                memcpy(&local_pref, &buff[read_length], 4);
                local_pref = ntohl(local_pref);
                route_data.path_attr.local_pref = local_pref;
                log(log_level::INFO, "Local Pref %d", local_pref);
            }
                break;
            case ATOMIC_AGGREGATE:
                log(log_level::INFO, "Atomic Aggregate");
                break;
            case AGGREGATOR:
            {
                uint32_t asn;
                if(peer->is_4_octet_as_supported){
                    memcpy(&asn, &buff[read_length], 4);
                    read_length += 4;
                }else{
                    uint16_t asn_2;
                    memcpy(&asn_2, &buff[read_length], 2);
                    read_length += 2;
                    asn = asn_2;
                }
                uint32_t address;
                memcpy(&address, &buff[read_length], 4);
                log(log_level::INFO, "Aggregator %d, %s", asn, inet_ntoa(in_addr{.s_addr = address}));
            }
                break;
            case AS4_PATH:
            {
                uint8_t segment_type = buff[read_length];
                uint8_t segment_length = buff[read_length + 1];
                if(segment_type == bgp_path_attribute_as_path_segment_type::AS_SEQUENCE){
                    std::string as_list_str;
                    for(int i = 0; i < segment_length; i++){
                        uint32_t asn;
                        memcpy(&asn, &buff[read_length + 2 + i * 4], 4);
                        asn = ntohl(asn);
                        std::ostringstream oss;
                        oss << asn;
                        as_list_str.append(" ");
                        as_list_str.append(oss.str());
                        /*
                        if(route_data.path_attr.as4_path_length < 64){
                            route_data.path_attr.as4_path[route_data.path_attr.as_path_length++] = asn;
                        }else{
                            log(log_level::WARNING, "Overflowed AS4 PATH %d", segment_length);
                        }*/
                    }
                    log(log_level::INFO, "AS4 Path%s", as_list_str.c_str());
                }else{
                    log(log_level::DEBUG, "Unable to interpret segment type %d", segment_type);
                }
            }
                break;
            default:
                log(log_level::INFO, "Unhandled path attributes type %d", type);
                break;
        }
        read_length += attribute_len;
    }
    return true;
}